

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::VectorAccumulator::getStdDev(VectorAccumulator *this,ResultType *ret)

{
  ResultType var;
  Vector<double,_3U> local_30;
  
  Vector<double,_3U>::Vector(&local_30);
  getVariance(this,(ResultType *)&local_30);
  if (local_30.data_[0] < 0.0) {
    local_30.data_[0] = sqrt(local_30.data_[0]);
  }
  else {
    local_30.data_[0] = SQRT(local_30.data_[0]);
  }
  (ret->super_Vector<double,_3U>).data_[0] = local_30.data_[0];
  if (local_30.data_[1] < 0.0) {
    local_30.data_[1] = sqrt(local_30.data_[1]);
  }
  else {
    local_30.data_[1] = SQRT(local_30.data_[1]);
  }
  (ret->super_Vector<double,_3U>).data_[1] = local_30.data_[1];
  if (local_30.data_[2] < 0.0) {
    local_30.data_[2] = sqrt(local_30.data_[2]);
  }
  else {
    local_30.data_[2] = SQRT(local_30.data_[2]);
  }
  (ret->super_Vector<double,_3U>).data_[2] = local_30.data_[2];
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      ResultType var;
      this->getVariance(var);
      ret[0] = sqrt(var[0]);
      ret[1] = sqrt(var[1]);
      ret[2] = sqrt(var[2]);
      return;
    }